

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_checkstack(lua_State *L,int size)

{
  CallInfo *pCVar1;
  int iVar2;
  int inuse;
  CallInfo *ci;
  int res;
  int size_local;
  lua_State *L_local;
  
  pCVar1 = L->ci;
  ci._4_4_ = size;
  _res = L;
  if ((long)size < (long)L->stack_last - (long)L->top >> 4) {
    ci._0_4_ = 1;
  }
  else if (1000000 - size < (int)((long)L->top - (long)L->stack >> 4) + 5) {
    ci._0_4_ = 0;
  }
  else {
    iVar2 = luaD_rawrunprotected(L,growstack,(void *)((long)&ci + 4));
    ci._0_4_ = (uint)(iVar2 == 0);
  }
  if (((uint)ci != 0) && (pCVar1->top < _res->top + ci._4_4_)) {
    pCVar1->top = _res->top + ci._4_4_;
  }
  return (uint)ci;
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int size) {
  int res;
  CallInfo *ci = L->ci;
  lua_lock(L);
  if (L->stack_last - L->top > size)  /* stack large enough? */
    res = 1;  /* yes; check is OK */
  else {  /* no; need to grow stack */
    int inuse = cast_int(L->top - L->stack) + EXTRA_STACK;
    if (inuse > LUAI_MAXSTACK - size)  /* can grow without overflow? */
      res = 0;  /* no */
    else  /* try to grow stack */
      res = (luaD_rawrunprotected(L, &growstack, &size) == LUA_OK);
  }
  if (res && ci->top < L->top + size)
    ci->top = L->top + size;  /* adjust frame top */
  lua_unlock(L);
  return res;
}